

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void finish_paybill(void)

{
  obj *otmp_00;
  int x;
  int y;
  int iVar1;
  int oy;
  int ox;
  obj *otmp;
  
  x = (int)repo_location.x;
  y = (int)repo_location.y;
  unwield_weapons_silently();
  unleash_all();
  while (otmp_00 = invent, invent != (obj *)0x0) {
    invent->owornmask = 0;
    *(uint *)&otmp_00->field_0x4a = *(uint *)&otmp_00->field_0x4a & 0xfff7ffff;
    iVar1 = rn2(5);
    if (iVar1 != 0) {
      curse(otmp_00);
    }
    obj_extract_self(otmp_00);
    place_object(otmp_00,level,x,y);
  }
  return;
}

Assistant:

void finish_paybill(void)
{
	struct obj *otmp;
	int ox = repo_location.x,
	    oy = repo_location.y;

	/* If twoweaponing and the swap weapon gets cursed, it slips to the
	 * ground and we get a warning message. */
	unwield_weapons_silently();

	/* normally done by savebones(), but that's too late in this case */
	unleash_all();
	/* transfer all of the character's inventory to the shop floor */
	while ((otmp = invent) != 0) {
	    otmp->owornmask = 0L;	/* perhaps we should call setnotworn? */
	    otmp->lamplit = 0;		/* avoid "goes out" msg from freeinv */
	    if (rn2(5)) curse(otmp);	/* normal bones treatment for invent */
	    obj_extract_self(otmp);
	    place_object(otmp, level, ox, oy);
	}
}